

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ReporterRegistry::~ReporterRegistry(ReporterRegistry *this)

{
  ~ReporterRegistry(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~ReporterRegistry() {
            deleteAllValues( m_factories );
        }